

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall
CLI::Option::transform
          (Option *this,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *func,string *transform_description,string *transform_name)

{
  iterator this_00;
  Option *in_RDI;
  value_type *in_stack_fffffffffffffe88;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *in_stack_fffffffffffffe90;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffffe98;
  const_iterator __position;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffee8;
  Validator *in_stack_fffffffffffffef0;
  Validator local_108 [2];
  Validator *local_30;
  
  local_30 = (Validator *)
             std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::begin
                       ((vector<CLI::Validator,_std::allocator<CLI::Validator>_> *)
                        in_stack_fffffffffffffe88);
  __gnu_cxx::
  __normal_iterator<CLI::Validator_const*,std::vector<CLI::Validator,std::allocator<CLI::Validator>>>
  ::__normal_iterator<CLI::Validator*>
            ((__normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
              *)in_stack_fffffffffffffe90,
             (__normal_iterator<CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
              *)in_stack_fffffffffffffe88);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &local_108[0].func_.super__Function_base._M_manager;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::
  function<CLI::Option::transform(std::function<std::__cxx11::string(std::__cxx11::string)>const&,std::__cxx11::string,std::__cxx11::string)::_lambda(std::__cxx11::string&)_1_,void>
            (in_stack_fffffffffffffea0,(anon_class_32_1_898bcfc2 *)in_stack_fffffffffffffe98);
  __position._M_current = local_108;
  ::std::__cxx11::string::string(in_stack_fffffffffffffed0,__str);
  ::std::__cxx11::string::string(in_stack_fffffffffffffed0,__str);
  Validator::Validator
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  this_00 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::insert
                      (in_stack_fffffffffffffe90,__position,in_stack_fffffffffffffe88);
  Validator::~Validator(this_00._M_current);
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00._M_current
            );
  ::std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00._M_current
            );
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x377e9c);
  transform(std::function<std::__cxx11::string(std::__cxx11::string)>const&,std::__cxx11::string,std::__cxx11::string)
  ::{lambda(std::__cxx11::string&)#1}::~function((anon_class_32_1_898bcfc2 *)0x377ea9);
  return in_RDI;
}

Assistant:

CLI11_INLINE Option *Option::transform(const std::function<std::string(std::string)> &func,
                                       std::string transform_description,
                                       std::string transform_name) {
    validators_.insert(validators_.begin(),
                       Validator(
                           [func](std::string &val) {
                               val = func(val);
                               return std::string{};
                           },
                           std::move(transform_description),
                           std::move(transform_name)));

    return this;
}